

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CovergroupType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CovergroupType,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation,slang::ast::CovergroupBodySymbol&>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2,
          CovergroupBodySymbol *args_3)

{
  string_view name;
  CovergroupType *pCVar1;
  Compilation *in_RCX;
  CovergroupType *in_RDX;
  SourceLocation in_RSI;
  size_t in_RDI;
  CovergroupBodySymbol *in_R8;
  char *unaff_retaddr;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pCVar1 = (CovergroupType *)
           allocate((BumpAllocator *)in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  name._M_str = unaff_retaddr;
  name._M_len = in_RDI;
  ast::CovergroupType::CovergroupType(in_RDX,in_RCX,name,in_RSI,in_R8);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }